

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subbreak3.cpp
# Opt level: O1

int __thiscall Cipher::Processor::init(Processor *this,EVP_PKEY_CTX *ctx)

{
  TClusters *clusters;
  _Rb_tree_header *p_Var1;
  undefined8 uVar2;
  double dVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 extraout_RAX;
  vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
  *in_RCX;
  TFreqMap *in_RDX;
  TSimilarityMap *this_00;
  Processor *pPVar6;
  TClusterToLetterMap *in_R9;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_70;
  void *local_40;
  undefined8 local_38;
  long lStack_30;
  
  uVar2 = *(undefined8 *)(ctx + 0x20);
  (this->m_params).wEnglishFreq = (float)(int)uVar2;
  (this->m_params).nHypothesesToKeep = (int)((ulong)uVar2 >> 0x20);
  uVar2 = *(undefined8 *)ctx;
  uVar4 = *(undefined8 *)(ctx + 8);
  uVar5 = *(undefined8 *)(ctx + 0x18);
  (this->m_params).fSpread = *(double *)(ctx + 0x10);
  (this->m_params).temp0 = (float)(int)uVar5;
  (this->m_params).coolingRate = (float)(int)((ulong)uVar5 >> 0x20);
  (this->m_params).minClusters = (int)uVar2;
  (this->m_params).maxClusters = (int)((ulong)uVar2 >> 0x20);
  (this->m_params).nInitialIters = (int)uVar4;
  (this->m_params).nIters = (int)((ulong)uVar4 >> 0x20);
  std::vector<int,_std::allocator<int>_>::operator=
            (&(this->m_params).hint,(vector<int,_std::allocator<int>_> *)(ctx + 0x28));
  this->m_freqMap = in_RDX;
  this_00 = &this->m_similarityMap;
  std::
  vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
  ::operator=(this_00,in_RCX);
  p_Var1 = &local_70._M_impl.super__Rb_tree_header;
  local_70._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_70._M_impl._0_8_ = 0;
  local_70._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_70._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_38 = 0;
  lStack_30 = 0;
  local_70._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_40 = (void *)0x0;
  (this->m_curResult).id = 0;
  (this->m_curResult).p = -999.0;
  (this->m_curResult).pClusters = -999.0;
  local_70._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_70._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::clear(&(this->m_curResult).clMap._M_t);
  if (local_70._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    (this->m_curResult).clMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         local_70._M_impl.super__Rb_tree_header._M_header._M_color;
    (this->m_curResult).clMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         local_70._M_impl.super__Rb_tree_header._M_header._M_parent;
    *(undefined4 *)&(this->m_curResult).clMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         local_70._M_impl.super__Rb_tree_header._M_header._M_left._0_4_;
    *(undefined4 *)
     ((long)&(this->m_curResult).clMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 4) =
         local_70._M_impl.super__Rb_tree_header._M_header._M_left._4_4_;
    *(undefined4 *)&(this->m_curResult).clMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right
         = local_70._M_impl.super__Rb_tree_header._M_header._M_right._0_4_;
    *(undefined4 *)
     ((long)&(this->m_curResult).clMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right + 4) =
         local_70._M_impl.super__Rb_tree_header._M_header._M_right._4_4_;
    (local_70._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
         &(this->m_curResult).clMap._M_t._M_impl.super__Rb_tree_header._M_header;
    (this->m_curResult).clMap._M_t._M_impl.super__Rb_tree_header._M_node_count =
         local_70._M_impl.super__Rb_tree_header._M_node_count;
    local_70._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_70._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_70._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    local_70._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  }
  clusters = &(this->m_curResult).clusters;
  std::vector<int,_std::allocator<int>_>::_M_move_assign(clusters,&local_40);
  if (local_40 != (void *)0x0) {
    operator_delete(local_40,lStack_30 - (long)local_40);
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree(&local_70);
  normalizeSimilarityMap(&this->m_params,this_00,&this->m_logMap,&this->m_logMapInv);
  pPVar6 = this;
  generateClustersInitialGuess(&this->m_params,this_00,clusters);
  this->m_nInitialIters = 0;
  dVar3 = calcPClusters(&pPVar6->m_params,this_00,&this->m_logMap,&this->m_logMapInv,clusters,in_R9)
  ;
  this->m_pCur = dVar3;
  (this->m_curResult).pClusters = dVar3;
  this->m_pZero = dVar3;
  return (int)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
}

Assistant:

bool Processor::init(
            const TParameters & params,
            const TFreqMap & freqMap,
            const TSimilarityMap & similarityMap) {
        m_params = params;
        m_freqMap = &freqMap;
        m_similarityMap = similarityMap;
        m_curResult = {};

        normalizeSimilarityMap(m_params, m_similarityMap, m_logMap, m_logMapInv);
        generateClustersInitialGuess(m_params, m_similarityMap, m_curResult.clusters);

        //Cipher::beamSearch(m_params, *m_freqMap, m_curResult);
        m_nInitialIters = 0;
        m_pCur = calcPClusters(m_params, m_similarityMap, m_logMap, m_logMapInv, m_curResult.clusters, m_curResult.clMap);
        m_curResult.pClusters = m_pCur;
        m_pZero = m_pCur;

        return true;
    }